

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O1

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addVariadicArgumentOperands
          (LLVMPointerGraphBuilder *this,Function *F,PSNode *arg)

{
  CallInst *CI;
  Function *pFVar1;
  long lVar2;
  
  lVar2 = *(long *)(F + 8);
  if (lVar2 != 0) {
    do {
      CI = *(CallInst **)(lVar2 + 0x18);
      if ((CI != (CallInst *)0x0) && (CI[0x10] == (CallInst)0x53)) {
        pFVar1 = *(Function **)(CI + -0x20);
        if (pFVar1 == (Function *)0x0) {
          pFVar1 = (Function *)0x0;
        }
        else if (pFVar1[0x10] != (Function)0x0) {
          pFVar1 = (Function *)0x0;
        }
        if ((pFVar1 == (Function *)0x0) || (*(long *)(pFVar1 + 0x18) != *(long *)(CI + 0x48))) {
          pFVar1 = (Function *)0x0;
        }
        if (pFVar1 == F) {
          addVariadicArgumentOperands(this,F,CI,arg);
        }
      }
      lVar2 = *(long *)(lVar2 + 8);
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addVariadicArgumentOperands(
        const llvm::Function *F, PSNode *arg) {
    using namespace llvm;

    for (auto I = F->use_begin(), E = F->use_end(); I != E; ++I) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
        const Value *use = *I;
#else
        const Value *use = I->getUser();
#endif
        const CallInst *CI = dyn_cast<CallInst>(use);
        if (CI && CI->getCalledFunction() == F)
            addVariadicArgumentOperands(F, CI, arg);
        // if this is funcptr, we handle it in the other
        // version of addVariadicArgumentOperands
    }
}